

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O3

void do_murder(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  CHAR_DATA *victim;
  char *__format;
  char *pcVar3;
  AFFECT_DATA af;
  char buf [4608];
  char arg [4608];
  
  one_argument(argument,arg);
  if (arg[0] == '\0') {
    pcVar3 = "Murder whom?\n\r";
LAB_00295612:
    send_to_char(pcVar3,ch);
    return;
  }
  bVar1 = is_affected_by(ch,0x12);
  if (!bVar1) {
    is_npc(ch);
  }
  victim = get_char_room(ch,arg);
  if (victim == (CHAR_DATA *)0x0) {
    pcVar3 = "They aren\'t here.\n\r";
    goto LAB_00295612;
  }
  if (victim == ch) {
    pcVar3 = "Suicide is a mortal sin.\n\r";
    goto LAB_00295612;
  }
  bVar1 = is_safe_new(ch,victim,true);
  if (bVar1) {
    return;
  }
  bVar1 = check_shroud_of_light(ch,victim);
  if (bVar1) {
    return;
  }
  bVar1 = check_sidestep(ch,victim,0,0x32);
  if (bVar1) {
    return;
  }
  bVar1 = is_affected_by(ch,0x12);
  if ((bVar1) && (ch->master == victim)) {
    act("$N is your beloved master.",ch,(void *)0x0,victim,3);
    return;
  }
  if (ch->position == 7) {
    pcVar3 = "You do the best you can!\n\r";
    goto LAB_00295612;
  }
  bVar1 = is_affected(ch,(int)gsn_rage);
  if (((bVar1) && (bVar1 = is_npc(ch), !bVar1)) && (ch->pcdata->tribe == 8)) {
    act("Charging towards $N, with the cunning of the Fox, you circle around and strike at $S exposed flank!"
        ,ch,(void *)0x0,victim,3);
    act("Charging towards you, $n abruptly circles around and strikes at your exposed flank!",ch,
        (void *)0x0,victim,2);
    act("Charging towards $N, $n abruptly circles around and strikes at $S exposed flank!",ch,
        (void *)0x0,victim,1);
    iVar2 = number_percent();
    if (((0x19 < iVar2) && (iVar2 = get_curr_stat(victim,0), 0xd < iVar2)) &&
       (iVar2 = get_curr_stat(victim,3), 9 < iVar2)) {
      act("A chilling tearing sound heralds the destruction of flesh and bone.",ch,(void *)0x0,
          (void *)0x0,4);
      init_affect(&af);
      af.where = 0;
      iVar2 = skill_lookup("torn muscles");
      af.type = (short)iVar2;
      af.aftype = 3;
      af.level = ch->level;
      af.duration = af.level / 0x14;
      af.location = 1;
      af.modifier = -2;
      affect_to_char(victim,&af);
      af.location = 2;
      affect_to_char(victim,&af);
    }
  }
  WAIT_STATE(ch,0xc);
  un_blade_barrier(ch,(char *)0x0);
  bVar1 = is_npc(victim);
  if ((bVar1) && (bVar1 = is_affected_by(victim,0x12), bVar1)) {
    pcVar3 = ch->short_descr;
    __format = "Help!  I am being attacked by %s!";
    goto LAB_0029585f;
  }
  bVar1 = is_npc(ch);
  if ((!bVar1) || (bVar1 = is_npc(victim), bVar1)) {
    bVar1 = is_npc(victim);
    if (bVar1) goto LAB_00295866;
    iVar2 = number_range(1,4);
    pcVar3 = pers(ch,victim);
    switch(iVar2) {
    default:
      goto switchD_0029581b_caseD_1;
    case 2:
      __format = "Die, %s, you treacherous fool!";
      break;
    case 3:
      __format = "Help!  %s is attacking me!";
      break;
    case 4:
      __format = "Die, %s, you foul dog!";
    }
  }
  else {
    pcVar3 = pers(ch,victim);
switchD_0029581b_caseD_1:
    __format = "Help!  I am being attacked by %s!";
  }
LAB_0029585f:
  sprintf(buf,__format,pcVar3);
LAB_00295866:
  bVar1 = is_npc(victim);
  if (!bVar1) {
    do_myell(victim,buf,ch);
  }
  check_blade_barrier(ch,victim);
  one_hit_new(ch,victim,-1,false,true,0,1,(char *)0x0);
  iVar2 = get_skill(ch,(int)gsn_third_attack);
  if (iVar2 == 0) {
    return;
  }
  iVar2 = number_percent();
  if (iVar2 < 0x33) {
    return;
  }
  one_hit_new(ch,victim,-1,false,true,0,1,(char *)0x0);
  return;
}

Assistant:

void do_murder(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH];
	char arg[MAX_INPUT_LENGTH];
	CHAR_DATA *victim;
	AFFECT_DATA af;
	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Murder whom?\n\r", ch);
		return;
	}

	if ((is_affected_by(ch, AFF_CHARM) || (is_npc(ch) && IS_SET(ch->act, ACT_PET))))
	{
		//        return;
	}

	victim = get_char_room(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (victim == ch)
	{
		send_to_char("Suicide is a mortal sin.\n\r", ch);
		return;
	}

	if (is_safe(ch, victim))
		return;

	if (check_shroud_of_light(ch, victim))
		return;

	if (check_sidestep(ch, victim, 0, 50))
		return;

	if (is_affected_by(ch, AFF_CHARM) && ch->master == victim)
	{
		act("$N is your beloved master.", ch, nullptr, victim, TO_CHAR);
		return;
	}

	if (ch->position == POS_FIGHTING)
	{
		send_to_char("You do the best you can!\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_rage) && !is_npc(ch) && ch->pcdata->tribe == TRIBE_FOX)
	{
		act("Charging towards $N, with the cunning of the Fox, you circle around and strike at $S exposed flank!", ch, 0, victim, TO_CHAR);
		act("Charging towards you, $n abruptly circles around and strikes at your exposed flank!", ch, 0, victim, TO_VICT);
		act("Charging towards $N, $n abruptly circles around and strikes at $S exposed flank!", ch, 0, victim, TO_NOTVICT);

		if (number_percent() > 25 && get_curr_stat(victim, STAT_STR) > 13 && get_curr_stat(victim, STAT_DEX) > 9)
		{
			act("A chilling tearing sound heralds the destruction of flesh and bone.", ch, 0, 0, TO_ALL);

			init_affect(&af);
			af.where = TO_AFFECTS;
			af.type = skill_lookup("torn muscles");
			af.aftype = AFT_MALADY;
			af.duration = ch->level / 20;
			af.level = ch->level;
			af.location = APPLY_STR;
			af.modifier = -2;
			affect_to_char(victim, &af);

			af.location = APPLY_DEX;
			affect_to_char(victim, &af);
		}
	}

	WAIT_STATE(ch, 1 * PULSE_VIOLENCE);

	un_blade_barrier(ch, nullptr);

	if (is_npc(victim) && is_affected_by(victim, AFF_CHARM))
	{
		sprintf(buf, "Help!  I am being attacked by %s!", ch->short_descr);
	}
	else if (is_npc(ch) && !is_npc(victim))
	{
		sprintf(buf, "Help!  I am being attacked by %s!", pers(ch, victim));
	}
	else if (!is_npc(victim))
	{
		switch (number_range(1, 4))
		{
			case 1:
				sprintf(buf, "Help!  I am being attacked by %s!", pers(ch, victim));
				break;
			case 2:
				sprintf(buf, "Die, %s, you treacherous fool!", pers(ch, victim));
				break;
			case 3:
				sprintf(buf, "Help!  %s is attacking me!", pers(ch, victim));
				break;
			case 4:
				sprintf(buf, "Die, %s, you foul dog!", pers(ch, victim));
				break;
			default:
				sprintf(buf, "Help!  I am being attacked by %s!", pers(ch, victim));
				break;
		}
	}

	/* Added a myell hack of yell so Enforcer cabal members can see if a PK
	yell is faked or not (see myell in act_comm.c for this).
	-Ceran
	*/
	if (!is_npc(victim))
		do_myell(victim, buf, ch);

	check_blade_barrier(ch, victim);
	one_hit(ch, victim, TYPE_UNDEFINED);

	if (get_skill(ch, gsn_third_attack) && number_percent() > 50)
		one_hit(ch, victim, TYPE_UNDEFINED);
}